

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaDefragmentationContext_T::AllocInOtherBlock
          (VmaDefragmentationContext_T *this,size_t start,size_t end,MoveAllocationData *data,
          VmaBlockVector *vector)

{
  bool bVar1;
  int iVar2;
  VkResult VVar3;
  VmaDeviceMemoryBlock *pVVar4;
  undefined4 extraout_var;
  ulong *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  VmaDefragmentationContext_T *in_RDI;
  void *unaff_retaddr;
  VmaAllocationCreateFlags in_stack_0000000c;
  VkDeviceSize in_stack_00000010;
  VkDeviceSize in_stack_00000018;
  VmaDeviceMemoryBlock *dstBlock;
  VmaAllocation *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  VmaDefragmentationMove *src;
  ulong local_18;
  
  local_18 = in_RSI;
  do {
    if (in_RDX <= local_18) {
      return false;
    }
    pVVar4 = VmaBlockVector::GetBlock
                       ((VmaBlockVector *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar2 = (*pVVar4->m_pMetadata->_vptr_VmaBlockMetadata[6])();
    if (*in_RCX <= CONCAT44(extraout_var,iVar2)) {
      in_stack_ffffffffffffffa8 = (undefined4)in_RCX[2];
      src = (VmaDefragmentationMove *)(in_RCX + 5);
      in_stack_ffffffffffffffb0 = 0;
      VVar3 = VmaBlockVector::AllocateFromBlock
                        (vector,dstBlock,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                         unaff_retaddr,(VmaSuballocationType)start,(uint32_t)this,in_stack_00000050)
      ;
      if (VVar3 == VK_SUCCESS) {
        VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::push_back
                  ((VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                   in_RDI,src);
        bVar1 = IncrementCounters(in_RDI,*in_RCX);
        if (!bVar1) {
          return false;
        }
        return true;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool VmaDefragmentationContext_T::AllocInOtherBlock(size_t start, size_t end, MoveAllocationData& data, VmaBlockVector& vector)
{
    for (; start < end; ++start)
    {
        VmaDeviceMemoryBlock* dstBlock = vector.GetBlock(start);
        if (dstBlock->m_pMetadata->GetSumFreeSize() >= data.size)
        {
            if (vector.AllocateFromBlock(dstBlock,
                data.size,
                data.alignment,
                data.flags,
                this,
                data.type,
                0,
                &data.move.dstTmpAllocation) == VK_SUCCESS)
            {
                m_Moves.push_back(data.move);
                if (IncrementCounters(data.size))
                    return true;
                break;
            }
        }
    }
    return false;
}